

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHeader.cpp
# Opt level: O0

void __thiscall Test<Imf_3_4::Header>::testIterators(Test<Imf_3_4::Header> *this,string *name)

{
  bool bVar1;
  Attribute *pAVar2;
  Attribute *pAVar3;
  Iterator iterator;
  Attribute *comparand;
  Header header;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  Vec2<float> local_50;
  Header local_48 [72];
  
  Imath_3_2::Vec2<float>::Vec2(&local_50,0.0,0.0);
  Imf_3_4::Header::Header(local_48,0x40,0x40,1.0,(Vec2 *)&local_50,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  Imf_3_4::Header::find((char *)local_48);
  pAVar2 = Imf_3_4::Header::Iterator::attribute((Iterator *)0x19f08d);
  Imf_3_4::Header::begin();
  while( true ) {
    Imf_3_4::Header::ConstIterator::ConstIterator
              ((ConstIterator *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
               (Iterator *)in_stack_ffffffffffffff28);
    Imf_3_4::Header::end();
    Imf_3_4::Header::ConstIterator::ConstIterator
              ((ConstIterator *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
               (Iterator *)in_stack_ffffffffffffff28);
    bVar1 = Imf_3_4::operator!=((ConstIterator *)
                                CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                                (ConstIterator *)in_stack_ffffffffffffff28);
    if (!bVar1) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testHeader.cpp"
                    ,0x39,
                    "void Test<Imf_3_4::Header>::testIterators(const string &) [Header = Imf_3_4::Header]"
                   );
    }
    Imf_3_4::Header::Iterator::name((Iterator *)0x19f11f);
    in_stack_ffffffffffffff37 =
         std::operator==((char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                         in_stack_ffffffffffffff28);
    if ((bool)in_stack_ffffffffffffff37) break;
    Imf_3_4::Header::Iterator::operator++
              ((Iterator *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  }
  pAVar3 = Imf_3_4::Header::Iterator::attribute((Iterator *)0x19f152);
  if (pAVar3 == pAVar2) {
    Imf_3_4::Header::~Header(local_48);
    return;
  }
  __assert_fail("&iterator.attribute () == &comparand",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testHeader.cpp"
                ,0x34,
                "void Test<Imf_3_4::Header>::testIterators(const string &) [Header = Imf_3_4::Header]"
               );
}

Assistant:

void testIterators (const string& name)
    {
        Header header;

        auto& comparand = header.find ("displayWindow").attribute ();

        for (auto iterator = header.begin (); iterator != header.end ();
             ++iterator)
        {
            if (iterator.name () == name)
            {
                assert (&iterator.attribute () == &comparand);
                return;
            }
        }

        assert (false);
    }